

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildingState.cpp
# Opt level: O0

void BuildingState::CmdSetShortDesc
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *this_00;
  undefined1 local_40 [8];
  shared_ptr<Room> room;
  shared_ptr<Player> player;
  shared_ptr<GameData> *game_data_local;
  shared_ptr<Connection> *connection_local;
  string *input_local;
  
  std::__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)connection
            );
  this = &room.super___shared_ptr<Room,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  Connection::GetPlayer((Connection *)this);
  std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  Entity::GetRoom((Entity *)local_40);
  this_00 = std::__shared_ptr_access<Room,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Room,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       local_40);
  Room::SetShortDesc(this_00,input);
  std::shared_ptr<Room>::~shared_ptr((shared_ptr<Room> *)local_40);
  std::shared_ptr<Player>::~shared_ptr
            ((shared_ptr<Player> *)
             &room.super___shared_ptr<Room,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void BuildingState::CmdSetShortDesc(const std::string &input, std::shared_ptr<Connection> connection,
                                    std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto room = player->GetRoom();
    room->SetShortDesc(input);
}